

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csprng.cpp
# Opt level: O1

result_type __thiscall jbcoin::csprng_engine::operator()(csprng_engine *this)

{
  int iVar1;
  result_type in_RAX;
  result_type ret;
  result_type local_18;
  
  local_18 = in_RAX;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  iVar1 = RAND_bytes((uchar *)&local_18,8);
  if (iVar1 != 0) {
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return local_18;
  }
  Throw<std::runtime_error,char_const(&)[21]>((char (*) [21])"Insufficient entropy");
}

Assistant:

csprng_engine::result_type
csprng_engine::operator()()
{
    result_type ret;

    std::lock_guard<std::mutex> lock (mutex_);

    auto const result = RAND_bytes (
        reinterpret_cast<unsigned char*>(&ret),
        sizeof(ret));

    if (result == 0)
        Throw<std::runtime_error> ("Insufficient entropy");

    return ret;
}